

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void trial::protocol::serialization::
     load_overloader<trial::protocol::json::basic_iarchive<char>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_void>
     ::load(basic_iarchive<char> *archive,
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           *data,uint protocol_version)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> value;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_58;
  
  json::basic_iarchive<char>::load<trial::protocol::json::token::begin_object>(archive);
  while ((archive->member).reader.decoder.current.code != end_object) {
    local_58.first._M_string_length = 0;
    local_58.first.field_2._M_local_buf[0] = '\0';
    local_58.second = false;
    local_58.first._M_dataplus._M_p = (pointer)&local_58.first.field_2;
    std::__cxx11::string::reserve((ulong)&local_58);
    json::basic_iarchive<char>::load<std::__cxx11::string>(archive,&local_58.first);
    json::basic_iarchive<char>::load<bool>(archive,&local_58.second);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,bool>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                *)data,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  json::basic_iarchive<char>::load<trial::protocol::json::token::end_object>(archive);
  return;
}

Assistant:

static void load(json::basic_iarchive<CharT>& archive,
                     std::map<std::string, T, Compare, MapAllocator>& data,
                     const unsigned int protocol_version)
    {
        archive.template load<json::token::begin_object>();
        while (!archive.template at<json::token::end_object>())
        {
            // We cannot use std::map<Key, T>::value_type because it has a const key
            std::pair<std::string, T> value;
            value.first.reserve(archive.reader().literal().size());
            archive.load_override(value.first, protocol_version);
            archive.load_override(value.second, protocol_version);
            data.insert(value);
        }
        archive.template load<json::token::end_object>();
    }